

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_change_class_name_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  byte bVar2;
  Am_Value *pAVar3;
  Am_String *pAVar4;
  Am_Value_List *pAVar5;
  byte local_d3;
  Am_Object local_a8;
  Am_Object cls;
  Am_String local_98;
  Am_String local_90;
  Am_Value_List local_88 [16];
  Am_Value_List local_78 [23];
  byte local_61;
  Am_String local_60;
  byte local_51;
  Am_String local_50;
  undefined4 local_44;
  Am_Object local_40;
  Am_Object local_38 [3];
  Am_String local_20;
  Am_String new_name;
  Am_String old_name;
  Am_Object *cmd_local;
  
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x16c);
  Am_String::Am_String(&new_name,pAVar3);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_String::Am_String(&local_20,pAVar3);
  bVar2 = Am_String::operator==(&new_name,"");
  if (((bVar2 & 1) == 0) || (bVar2 = Am_String::operator==(&local_20,""), (bVar2 & 1) == 0)) {
    bVar2 = Am_String::operator==(&new_name,(Am_String *)&local_20);
    if ((bVar2 & 1) == 0) {
      local_51 = 0;
      local_61 = 0;
      bVar2 = Am_String::operator==(&local_20,"");
      local_d3 = 1;
      if ((bVar2 & 1) == 0) {
        Am_String::Am_String(&local_50,(Am_String *)&new_name);
        local_51 = 1;
        Am_String::Am_String(&local_60,(Am_String *)&local_20);
        local_61 = 1;
        local_d3 = Am_Gesture_Trainer::Rename_Class
                             ((Am_String *)&trainer,(Am_String *)&local_50,SUB81(&local_60,0));
        local_d3 = local_d3 ^ 0xff;
      }
      if ((local_61 & 1) != 0) {
        Am_String::~Am_String(&local_60);
      }
      if ((local_51 & 1) != 0) {
        Am_String::~Am_String(&local_50);
      }
      if ((local_d3 & 1) == 0) {
        pAVar3 = (Am_Value *)Am_Object::Get(0x5510,0x169);
        Am_Object::Am_Object(&local_a8,pAVar3);
        Am_Object::Set((ushort)&local_a8,(Am_String *)(ulong)(ushort)CLASS_NAME,(ulong)&local_20);
        dirty = true;
        Am_Object::~Am_Object(&local_a8);
        local_44 = 0;
      }
      else {
        Am_Value_List::Am_Value_List(local_88);
        Am_String::Am_String(&local_90,"A class named",true);
        pAVar4 = (Am_String *)
                 Am_Value_List::Add((Am_String *)local_88,(Am_Add_Position)&local_90,true);
        pAVar4 = (Am_String *)Am_Value_List::Add(pAVar4,(Am_Add_Position)&local_20,true);
        Am_String::Am_String(&local_98,"already exists.",true);
        pAVar5 = (Am_Value_List *)Am_Value_List::Add(pAVar4,(Am_Add_Position)&local_98,true);
        Am_Value_List::Am_Value_List(local_78,pAVar5);
        Popup_Error(local_78);
        Am_Value_List::~Am_Value_List(local_78);
        Am_String::~Am_String(&local_98);
        Am_String::~Am_String(&local_90);
        Am_Value_List::~Am_Value_List(local_88);
        Am_Object::Set(0x5518,(Am_String *)0x169,(ulong)&new_name);
        Am_Object::Get_Object((ushort)&cls,0x115518);
        Am_Object::Set((ushort)&cls,(Am_String *)0x169,(ulong)&new_name);
        Am_Object::~Am_Object(&cls);
        local_44 = 1;
      }
    }
    else {
      local_44 = 1;
    }
  }
  else {
    Am_Object::Am_Object(local_38,(Am_Object *)&Am_No_Object);
    Am_Beep((Am_Object *)local_38);
    Am_Object::~Am_Object(local_38);
    pAVar1 = do_delete_class.Call;
    Am_Object::Am_Object(&local_40,(Am_Object *)cmd);
    (*pAVar1)((Am_Object_Data *)&local_40);
    Am_Object::~Am_Object(&local_40);
    local_44 = 1;
  }
  Am_String::~Am_String(&local_20);
  Am_String::~Am_String(&new_name);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_change_class_name, (Am_Object cmd))
{
  Am_String old_name = cmd.Get(Am_OLD_VALUE);
  Am_String new_name = cmd.Get(Am_VALUE);

  //  cout << "Renaming class " << old_name << " to " << new_name << endl;

  if (old_name == NEW_CLASS_NAME && new_name == NEW_CLASS_NAME) {
    // user was entering name for a new class, but didn't change it.
    // Delete the new class
    extern Am_Object_Method do_delete_class;
    Am_Beep();
    do_delete_class.Call(cmd);
    return;
  }

  if (old_name == new_name)
    return;

  // change name in trainer

  if (new_name == ""                               // can't erase name
      || !trainer.Rename_Class(old_name, new_name) // or duplicate another
      ) {
    Popup_Error(Am_Value_List()
                    .Add(Am_String("A class named"))
                    .Add(new_name)
                    .Add(Am_String("already exists.")));

    // undo edit to current_class_name widget
    current_class_name.Set(Am_VALUE, old_name);
    current_class_name.Get_Object(Am_COMMAND).Set(Am_VALUE, old_name);
    return;
  }

  // now update Class object

  Am_Object cls = class_panel.Get(Am_VALUE);
  cls.Set(CLASS_NAME, new_name);

  // the classifier has changed, so set dirty flag
  dirty = true;
}